

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void ff_white_wizard(dw_rom *rom)

{
  vpatch(rom,0x1335,0xf,3,0,0x43,2,3,3,3,0,3,0,0x43,3,0x43,2,0x43);
  vpatch(rom,0x1395,0xf,3,0xc,0x43,0xf,0x43,0xe,0x43,0xc,3,0xc,0x43,0xe,3,0xf,3);
  vpatch(rom,0x13b4,0x4f,0x50,2,0x51,2,0x52,0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,0,0x50,2,0x51,2,0x52,
         0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,0,0x50,2,0x51,2,0x52,0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,
         0,0x50,2,0x51,2,0x52,0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,0,0x50);
  vpatch(rom,0x1415,0xf,2,0xc5,2,0xc6,2,199,2,0xc4,2,200,2,0xc9,2,0xca,2);
  vpatch(rom,0x1435,0xf,3,5,3,6,3,7,3,4,3,5,3,8,3,9,3);
  vpatch(rom,0x1495,0xf,3,0x11,3,0x14,3,0x15,3,0x10,3,0x11,3,0x12,3,0x13,3);
  vpatch(rom,0x14b4,0x14,0x48,2,0x49,2,0x4a,0,0x4b,0,0x4c,2,0x4d,2,0x4e,0,0x4f,0,0x48,2,0x49,2);
  vpatch(rom,0x14cd,0x1b,2,0x4d,2,0x4e,0,0x4f,0,0x48,2,0x49,2,0x4a,0,0x4b,0,0x4c,2,0x4d,2,0x4e,0,
         0x4f,0,0x48,2,0x49,2);
  vpatch(rom,0x14ed,0x14,2,0x4d,2,0x4e,0,0x4f,0,0x48,2,0xa9,2,0x4a,0,0xab,3,0x4c,2,0xad,2,0x4e);
  vpatch(rom,0x1515,0xf,2,0xcb,2,0xcc,2,0xcd,2,0xce,2,0xcf,2,0xd0,2,0xd1,2);
  vpatch(rom,0x1535,0xf,3,1,0x43,10,3,0xb,3,1,3,1,0x43,0xb,0x43,10,0x43);
  vpatch(rom,0x1595,0xf,3,0xd,0x43,0x16,3,0x17,3,0xd,3,0xd,0x43,0x17,0x43,0x16,0x43);
  vpatch(rom,0x15b4,0x44,0x30,2,0x31,2,0x32,0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,0,0x30,2,0x31,2,0x32,
         0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,0,0x30,2,0x31,2,0x32,0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,
         0,0x30,2,0x31,2,0x32,0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,2,0x35,2);
  vpatch(rom,0x1615,0xf,2,0xd3,2,0xd4,2,0xd5,2,0xd6,2,0xd3,2,0xd7,2,0x92,2);
  vpatch(rom,0x1635,0xf,0x43,4,0x43,7,0x43,6,0x43,5,0x43,4,0x43,9,0x43,8,0x43);
  vpatch(rom,0x1695,0xf,0x43,0x10,0x43,0x15,0x43,0x14,0x43,0x11,0x43,0x10,0x43,0x13,0x43,0x12,0x43);
  vpatch(rom,0x16b4,0x44,0x40,2,0x41,2,0x42,0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,0,0x40,2,0x41,2,0x42,
         0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,0,0x40,2,0x41,2,0x42,0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,
         0,0x40,2,0x41,2,0x42,0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,2,0x45,2);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1719,0xb,2,0xd3,2,0xd4,2,0xd5,2,0xd6,2,0xd7,2);
  vpatch(rom,0x1a8b,9,0x30,0x36,0xf,0x35,0x27,0x1a,0x36,0xf,0x16);
  vpatch(rom,0x12300,0x80,0,3,7,7,0xf,0xc,0x1d,0x1b,3,7,0xf,0xf,0x1f,0x1f,0x3a,0x3c,0,0xc0,0xf0,0xf8
         ,0xe8,0x90,0xa0,0xc0,0xc0,0xf0,0xf8,0xbc,0x1c,0x78,0x58,0x3c,0x7f,0xff,0xff,0xff,0xff,0x5f,
         0x3f,0x1f,0x53,0x89,0x84,0x90,0x98,0x70,0x36,0x18,0xfe,0xfe,0xff,0xff,0xfa,0xfc,0xf8,0xfc,
         0xea,0xc2,0x21,0x29,0x5e,0xc,0x18,0x3c,0);
  vpatch(rom,0x12400,0x180,0,7,0xf,0x17,0x17,8,5,7,7,0xf,0x1f,0x3b,0x39,0x1f,10,8,0,0x80,0xc0,0xe0,
         0xe0,0xf0,0xd8,0x28,0x80,0xc0,0xe0,0xf0,0xf0,0xf8,0x7c,0xfc,0xf,0xf,0xf,0xf,0xe,0xf,0xf,0xf
         ,0xf,0xc,10,0xd,0xb,9,8,0xd,0xf8,0xf0,0xf0,0x78,0x78,0xf8,0xf8,0xfc,0x58,0x50,0x90,0x88,
         0x88,0x98,0x68,0xc,0);
  vpatch(rom,0x12600,0x18,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0x3c,0x3c,0x38,0x30,0x20,0,1,0x7e);
  vpatch(rom,0x12620,0x18,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0xe0,0x1c);
  vpatch(rom,0x12640,0x18,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0x3c,0x3c,0x38,0x30,0x20,0,0x3c,0x43);
  vpatch(rom,0x12660,0x18,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0xfe);
  vpatch(rom,0x12840,0x18,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0xe0,0xe0,0xc0,0xc0,0x80,0,0,0xfe);
  vpatch(rom,0x12860,0x18,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0x36,0,0x16,0x36);
  vpatch(rom,0x12970,0x98,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,
         0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12a10,8,0x47,199,0xc3,0x43,0x41,0x40,0x5e,0x61);
  vpatch(rom,0x12c20,8,199,199,0x43,0x43,0x41,0x40,0x40,0x7f);
  vpatch(rom,0x12c30,8,0xe0,0xe0,0xc0,0xc0,0x80,0,0x78,0x86);
  vpatch(rom,0x12f00,8,0,0,0,0,0xd,0,0,0);
  vpatch(rom,0x12f10,8,6,7,7,1,0xb1,3,2,2);
  vpatch(rom,0x12f20,8,0,0,0x18,0x18,0,0,0,0x7f);
  vpatch(rom,0x12f30,8,3,1,0,0,2,2,0x7a,0x86);
  vpatch(rom,0x12f40,8,0,6,7,7,0xb1,1,3,2);
  vpatch(rom,0x12f50,8,0,0,0x18,0x18,0,0,0x1e,0x61);
  vpatch(rom,0x12f60,8,2,3,1,0,0,2,2,0xfe);
  vpatch(rom,0x12f70,8,0,0,0,0,3,0,0,0);
  vpatch(rom,0x12f80,8,0x30,0x70,0x70,0x40,0x6c,0x20,0x68,0x6c);
  vpatch(rom,0x12f90,8,0,0,0,0,0,0,7,0x78);
  vpatch(rom,0x12fa0,8,0x7c,0x7c,0x3c,0x2c,0x24,0x20,0xa0,0x7e);
  vpatch(rom,0x12fb0,8,0,0x30,0x70,0x70,0x6c,0x60,0x68,0x6c);
  vpatch(rom,0x12fc0,8,0,0,0,0,0,0,0,0x7f);
  vpatch(rom,0x12fd0,8,0x3c,0x7c,0x7c,0x2c,0x24,0x20,0x3c,0xe2);
  vpatch(rom,0x12fe0,8,0x60,0xe0,0xe0,0x80,0x8d,0xc0,0x4d,0x4d);
  vpatch(rom,0x12ff0,8,0,0,0,0,0xb0,0,0xb0,0xb0);
  if ((rom->flags[0xe] & 8) == 0) {
    return;
  }
  set_text(rom,0x7e56,anon_var_dwarf_90e);
  return;
}

Assistant:

static void ff_white_wizard(dw_rom *rom)
{
    vpatch(rom, 0x01335,   15,  0x03,  0x00,  0x43,  0x02,  0x03,  0x03,  0x03,  0x00,  0x03,  0x00,  0x43,  0x03,  0x43,  0x02,  0x43);
    vpatch(rom, 0x01395,   15,  0x03,  0x0c,  0x43,  0x0f,  0x43,  0x0e,  0x43,  0x0c,  0x03,  0x0c,  0x43,  0x0e,  0x03,  0x0f,  0x03);
    vpatch(rom, 0x013b4,   79,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57);
    vpatch(rom, 0x01415,   15,  0x02,  0xc5,  0x02,  0xc6,  0x02,  0xc7,  0x02,  0xc4,  0x02,  0xc8,  0x02,  0xc9,  0x02,  0xca,  0x02);
    vpatch(rom, 0x01435,   15,  0x03,  0x05,  0x03,  0x06,  0x03,  0x07,  0x03,  0x04,  0x03,  0x05,  0x03,  0x08,  0x03,  0x09,  0x03);
    vpatch(rom, 0x01495,   15,  0x03,  0x11,  0x03,  0x14,  0x03,  0x15,  0x03,  0x10,  0x03,  0x11,  0x03,  0x12,  0x03,  0x13,  0x03);
    vpatch(rom, 0x014b4,   20,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0x49,  0x02);
    vpatch(rom, 0x014cd,   27,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0x49,  0x02);
    vpatch(rom, 0x014ed,   20,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0xa9,  0x02,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x02,  0xad,  0x02,  0x4e);
    vpatch(rom, 0x01515,   15,  0x02,  0xcb,  0x02,  0xcc,  0x02,  0xcd,  0x02,  0xce,  0x02,  0xcf,  0x02,  0xd0,  0x02,  0xd1,  0x02);
    vpatch(rom, 0x01535,   15,  0x03,  0x01,  0x43,  0x0a,  0x03,  0x0b,  0x03,  0x01,  0x03,  0x01,  0x43,  0x0b,  0x43,  0x0a,  0x43);
    vpatch(rom, 0x01595,   15,  0x03,  0x0d,  0x43,  0x16,  0x03,  0x17,  0x03,  0x0d,  0x03,  0x0d,  0x43,  0x17,  0x43,  0x16,  0x43);
    vpatch(rom, 0x015b4,   68,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31,  0x02);
    vpatch(rom, 0x015fe,    2,  0x35,  0x02);
    vpatch(rom, 0x01615,   15,  0x02,  0xd3,  0x02,  0xd4,  0x02,  0xd5,  0x02,  0xd6,  0x02,  0xd3,  0x02,  0xd7,  0x02,  0x92,  0x02);
    vpatch(rom, 0x01635,   15,  0x43,  0x04,  0x43,  0x07,  0x43,  0x06,  0x43,  0x05,  0x43,  0x04,  0x43,  0x09,  0x43,  0x08,  0x43);
    vpatch(rom, 0x01695,   15,  0x43,  0x10,  0x43,  0x15,  0x43,  0x14,  0x43,  0x11,  0x43,  0x10,  0x43,  0x13,  0x43,  0x12,  0x43);
    vpatch(rom, 0x016b4,   68,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41,  0x02);
    vpatch(rom, 0x016fe,    2,  0x45,  0x02);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01719,   11,  0x02,  0xd3,  0x02,  0xd4,  0x02,  0xd5,  0x02,  0xd6,  0x02,  0xd7,  0x02);
    vpatch(rom, 0x01a8b,    9,  0x30,  0x36,  0x0f,  0x35,  0x27,  0x1a,  0x36,  0x0f,  0x16);
    vpatch(rom, 0x12300,  128,  0x00,  0x03,  0x07,  0x07,  0x0f,  0x0c,  0x1d,  0x1b,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x3a,  0x3c,  0x00,  0xc0,  0xf0,  0xf8,  0xe8,  0x90,  0xa0,  0xc0,  0xc0,  0xf0,  0xf8,  0xbc,  0x1c,  0x78,  0x58,  0x3c,  0x7f,  0xff,  0xff,  0xff,  0xff,  0x5f,  0x3f,  0x1f,  0x53,  0x89,  0x84,  0x90,  0x98,  0x70,  0x36,  0x18,  0xfe,  0xfe,  0xff,  0xff,  0xfa,  0xfc,  0xf8,  0xfc,  0xea,  0xc2,  0x21,  0x29,  0x5e,  0x0c,  0x18,  0x3c,  0x00,  0x03,  0x0f,  0x1f,  0x17,  0x09,  0x05,  0x03,  0x03,  0x0f,  0x1f,  0x3d,  0x38,  0x1e,  0x1a,  0x3c,  0x00,  0xc0,  0xe0,  0xe0,  0xf0,  0x30,  0xb8,  0xd8,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0x5c,  0x3c,  0x7f,  0x7f,  0xff,  0xff,  0x5f,  0x3f,  0x1f,  0x3f,  0x57,  0x43,  0x84,  0x94,  0x7a,  0x30,  0x18,  0x3c,  0xfe,  0xff,  0xff,  0xff,  0xff,  0xfa,  0xfc,  0xf8,  0xca,  0x91,  0x21,  0x09,  0x19,  0x0e,  0x6c,  0x18);
    vpatch(rom, 0x12400,  384,  0x00,  0x07,  0x0f,  0x17,  0x17,  0x08,  0x05,  0x07,  0x07,  0x0f,  0x1f,  0x3b,  0x39,  0x1f,  0x0a,  0x08,  0x00,  0x80,  0xc0,  0xe0,  0xe0,  0xf0,  0xd8,  0x28,  0x80,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0x7c,  0xfc,  0x0f,  0x0f,  0x0f,  0x0f,  0x0e,  0x0f,  0x0f,  0x0f,  0x0f,  0x0c,  0x0a,  0x0d,  0x0b,  0x09,  0x08,  0x0d,  0xf8,  0xf0,  0xf0,  0x78,  0x78,  0xf8,  0xf8,  0xfc,  0x58,  0x50,  0x90,  0x88,  0x88,  0x98,  0x68,  0x0c,  0x00,  0x00,  0x07,  0x0f,  0x17,  0x17,  0x08,  0x05,  0x00,  0x07,  0x0f,  0x1f,  0x3b,  0x39,  0x1f,  0x0a,  0x00,  0x00,  0x80,  0xc0,  0xe0,  0xf8,  0xe4,  0xb0,  0x00,  0x80,  0xc0,  0xe0,  0xf8,  0xfc,  0xfe,  0x7c,  0x08,  0x0f,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x27,  0x0f,  0x0f,  0x0d,  0x0a,  0x12,  0x14,  0x10,  0x38,  0xf0,  0xf0,  0xf0,  0xf8,  0xb8,  0x98,  0xfc,  0xfc,  0xb0,  0x50,  0x50,  0x48,  0xe8,  0xe8,  0xc4,  0xc4,  0x00,  0x00,  0x01,  0x03,  0x07,  0x1f,  0x27,  0x0d,  0x00,  0x01,  0x03,  0x07,  0x1f,  0x3f,  0x7f,  0x3e,  0x00,  0x00,  0xe0,  0xf0,  0xe8,  0xe8,  0x10,  0xa0,  0x00,  0xe0,  0xf0,  0xf8,  0xdc,  0x9c,  0xf8,  0x50,  0x0f,  0x0f,  0x0f,  0x1f,  0x1d,  0x19,  0x3f,  0x3f,  0x0d,  0x0a,  0x0a,  0x12,  0x17,  0x17,  0x23,  0x23,  0x10,  0xf0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0xe4,  0xf0,  0xf0,  0xb0,  0x50,  0x48,  0x28,  0x08,  0x1c,  0x00,  0x01,  0x03,  0x07,  0x07,  0x0f,  0x1b,  0x14,  0x01,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x3e,  0x3f,  0x00,  0xe0,  0xf0,  0xe8,  0xe8,  0x10,  0xa0,  0xe0,  0xe0,  0xf0,  0xf8,  0xdc,  0x9c,  0xf8,  0x50,  0x10,  0x1f,  0x0f,  0x0f,  0x1e,  0x1e,  0x1f,  0x1f,  0x3f,  0x1a,  0x0a,  0x09,  0x11,  0x11,  0x19,  0x16,  0x30,  0xf0,  0xf0,  0xf0,  0xf0,  0x70,  0xf0,  0xf0,  0xf0,  0xf0,  0x30,  0x50,  0xb0,  0xd0,  0x90,  0x10,  0xb0,  0x00,  0x03,  0x07,  0x0f,  0x0f,  0x0f,  0x0b,  0x15,  0x03,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x3f,  0x00,  0x80,  0xc0,  0xe0,  0xe0,  0xe0,  0xb0,  0x68,  0x80,  0xc0,  0xe0,  0xf0,  0xf0,  0xf0,  0xf8,  0xfc,  0x7f,  0xff,  0xff,  0xff,  0x9f,  0x5f,  0x3f,  0x1f,  0x56,  0x88,  0x84,  0x90,  0xf8,  0x70,  0x36,  0x18,  0xfe,  0xfe,  0xff,  0xff,  0xfe,  0xf8,  0xf8,  0xfc,  0xaa,  0x02,  0x21,  0x29,  0x5e,  0x08,  0x18,  0x3c,  0x00,  0x01,  0x03,  0x07,  0x07,  0x07,  0x0d,  0x16,  0x01,  0x03,  0x07,  0x0f,  0x0f,  0x0f,  0x1f,  0x3f,  0x00,  0xc0,  0xe0,  0xf0,  0xf0,  0xf0,  0xd0,  0xa8,  0xc0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xfc,  0x7f,  0x7f,  0xff,  0xff,  0x7f,  0x1f,  0x1f,  0x3f,  0x55,  0x40,  0x84,  0x94,  0x7a,  0x10,  0x18,  0x3c,  0xfe,  0xff,  0xff,  0xff,  0xf9,  0xfa,  0xfc,  0xf8,  0x6a,  0x11,  0x21,  0x09,  0x1f,  0x0e,  0x6c,  0x18);
    vpatch(rom, 0x12600,   24,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x3c,  0x3c,  0x38,  0x30,  0x20,  0x00,  0x01,  0x7e);
    vpatch(rom, 0x12620,   24,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe0,  0x1c);
    vpatch(rom, 0x12640,   24,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x3c,  0x3c,  0x38,  0x30,  0x20,  0x00,  0x3c,  0x43);
    vpatch(rom, 0x12660,   24,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xfe);
    vpatch(rom, 0x12840,   24,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe0,  0xe0,  0xc0,  0xc0,  0x80,  0x00,  0x00,  0xfe);
    vpatch(rom, 0x12860,   24,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x36,  0x00,  0x16,  0x36);
    vpatch(rom, 0x12970,  152,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x60,  0xe0,  0xe0,  0x8d,  0x80,  0xcd,  0x4d);
    vpatch(rom, 0x12a10,    8,  0x47,  0xc7,  0xc3,  0x43,  0x41,  0x40,  0x5e,  0x61);
    vpatch(rom, 0x12c20,    8,  0xc7,  0xc7,  0x43,  0x43,  0x41,  0x40,  0x40,  0x7f);
    vpatch(rom, 0x12c30,    8,  0xe0,  0xe0,  0xc0,  0xc0,  0x80,  0x00,  0x78,  0x86);
    vpatch(rom, 0x12f00,    8,  0x00,  0x00,  0x00,  0x00,  0x0d,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12f10,    8,  0x06,  0x07,  0x07,  0x01,  0xb1,  0x03,  0x02,  0x02);
    vpatch(rom, 0x12f20,    8,  0x00,  0x00,  0x18,  0x18,  0x00,  0x00,  0x00,  0x7f);
    vpatch(rom, 0x12f30,    8,  0x03,  0x01,  0x00,  0x00,  0x02,  0x02,  0x7a,  0x86);
    vpatch(rom, 0x12f40,    8,  0x00,  0x06,  0x07,  0x07,  0xb1,  0x01,  0x03,  0x02);
    vpatch(rom, 0x12f50,    8,  0x00,  0x00,  0x18,  0x18,  0x00,  0x00,  0x1e,  0x61);
    vpatch(rom, 0x12f60,    8,  0x02,  0x03,  0x01,  0x00,  0x00,  0x02,  0x02,  0xfe);
    vpatch(rom, 0x12f70,    8,  0x00,  0x00,  0x00,  0x00,  0x03,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12f80,    8,  0x30,  0x70,  0x70,  0x40,  0x6c,  0x20,  0x68,  0x6c);
    vpatch(rom, 0x12f90,    8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x07,  0x78);
    vpatch(rom, 0x12fa0,    8,  0x7c,  0x7c,  0x3c,  0x2c,  0x24,  0x20,  0xa0,  0x7e);
    vpatch(rom, 0x12fb0,    8,  0x00,  0x30,  0x70,  0x70,  0x6c,  0x60,  0x68,  0x6c);
    vpatch(rom, 0x12fc0,    8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x7f);
    vpatch(rom, 0x12fd0,    8,  0x3c,  0x7c,  0x7c,  0x2c,  0x24,  0x20,  0x3c,  0xe2);
    vpatch(rom, 0x12fe0,    8,  0x60,  0xe0,  0xe0,  0x80,  0x8d,  0xc0,  0x4d,  0x4d);
    vpatch(rom, 0x12ff0,    8,  0x00,  0x00,  0x00,  0x00,  0xb0,  0x00,  0xb0,  0xb0);
    ff_spells(rom);
}